

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QIconEngine * __thiscall QIconLoader::iconEngine(QIconLoader *this,QString *iconName)

{
  QPlatformTheme *pQVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  QDebug *pQVar5;
  QHash<QAbstractFileIconProvider::IconType,_QIcon> *pQVar6;
  QObject *object;
  QIconEnginePlugin *pQVar7;
  QIconEnginePlugin **ppQVar8;
  QFontIconEngine *this_00;
  QFontIconEngine *pQVar9;
  undefined4 extraout_var;
  pointer __old_p;
  pointer __old_p_1;
  long in_FS_OFFSET;
  QIconEngine local_90;
  undefined1 local_88 [8];
  QDebug local_80;
  QArrayDataPointer<QString> local_78;
  char *local_60;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78.d._0_4_ = 2;
    local_78._4_8_ = 0;
    local_78._12_8_ = 0;
    local_78.size._4_4_ = 0;
    local_60 = lcIconLoader::category.name;
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)&local_58,"Resolving icon engine for icon");
    QDebug::operator<<(pQVar5,iconName);
    QDebug::~QDebug((QDebug *)&local_58);
  }
  bVar2 = (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
          super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged;
  if ((bool)bVar2 == false) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_78.d._0_4_ = 2;
      local_78._4_8_ = 0;
      local_78._12_8_ = 0;
      local_78.size._4_4_ = 0;
      local_60 = lcIconLoader::category.name;
      QMessageLogger::debug();
      pQVar5 = QDebug::operator<<(&local_80,"Finding a plugin for theme");
      themeName((QString *)&local_58,this);
      QDebug::operator<<(pQVar5,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QDebug::~QDebug(&local_80);
    }
    pQVar6 = qt_iconEngineFactoryLoader();
    themeName((QString *)&local_78,this);
    iVar4 = QFactoryLoader::indexOf((QString *)pQVar6);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    if (iVar4 < 0) {
      bVar2 = (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
              super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged;
      goto LAB_0026274c;
    }
    pQVar6 = qt_iconEngineFactoryLoader();
    object = (QObject *)QFactoryLoader::instance((int)pQVar6);
    pQVar7 = QtPrivate::qobject_cast_helper<QIconEnginePlugin*,QObject>(object);
    (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
    super__Optional_payload_base<QIconEnginePlugin_*>._M_payload._M_value = pQVar7;
    (this->m_factory).super__Optional_base<QIconEnginePlugin_*,_true,_true>._M_payload.
    super__Optional_payload_base<QIconEnginePlugin_*>._M_engaged = true;
LAB_00262750:
    ppQVar8 = std::
              _Optional_base_impl<QIconEnginePlugin_*,_std::_Optional_base<QIconEnginePlugin_*,_true,_true>_>
              ::_M_get((_Optional_base_impl<QIconEnginePlugin_*,_std::_Optional_base<QIconEnginePlugin_*,_true,_true>_>
                        *)&this->m_factory);
    if (*ppQVar8 == (QIconEnginePlugin *)0x0) goto LAB_0026277b;
    ppQVar8 = std::optional<QIconEnginePlugin_*>::value(&this->m_factory);
    this_00 = (QFontIconEngine *)(**(code **)(*(long *)*ppQVar8 + 0x60))();
  }
  else {
LAB_0026274c:
    if ((bVar2 & 1) != 0) goto LAB_00262750;
LAB_0026277b:
    this_00 = (QFontIconEngine *)0x0;
  }
  if ((this->m_userTheme).d.size == 0) {
    if (this_00 != (QFontIconEngine *)0x0) goto LAB_0026295f;
    this_00 = (QFontIconEngine *)0x0;
  }
  else {
    if ((this_00 == (QFontIconEngine *)0x0) ||
       (iVar4 = (*(this_00->super_QIconEngine)._vptr_QIconEngine[0xd])(this_00), (char)iVar4 != '\0'
       )) {
      QFontDatabase::families((QStringList *)&local_78,Any);
      themeName((QString *)&local_58,this);
      bVar3 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)&local_78,(QString *)&local_58,
                         CaseSensitive);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      if (bVar3) {
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        themeName((QString *)&local_78,this);
        QFont::QFont((QFont *)&local_58,(QString *)&local_78,-1,-1,false);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        QFont::setStyleStrategy((QFont *)&local_58,NoFontMerging);
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_78.d._0_4_ = 2;
          local_78._4_8_ = 0;
          local_78._12_8_ = 0;
          local_78.size._4_4_ = 0;
          local_60 = lcIconLoader::category.name;
          QMessageLogger::debug();
          QDebug::operator<<(&local_80,"Trying font icon engine.");
          QDebug::~QDebug(&local_80);
        }
        pQVar9 = (QFontIconEngine *)operator_new(0x58);
        QFontIconEngine::QFontIconEngine(pQVar9,iconName,(QFont *)&local_58);
        if (this_00 != (QFontIconEngine *)0x0) {
          (*(this_00->super_QIconEngine)._vptr_QIconEngine[1])(this_00);
        }
        QFont::~QFont((QFont *)&local_58);
        this_00 = pQVar9;
        goto LAB_002628d2;
      }
      if (this_00 != (QFontIconEngine *)0x0) goto LAB_002628d2;
      pQVar9 = (QFontIconEngine *)0x0;
    }
    else {
LAB_002628d2:
      iVar4 = (*(this_00->super_QIconEngine)._vptr_QIconEngine[0xd])(this_00);
      pQVar9 = this_00;
      if ((char)iVar4 == '\0') goto LAB_0026295f;
    }
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_78.d._0_4_ = 2;
      local_78._4_8_ = 0;
      local_78._12_8_ = 0;
      local_78.size._4_4_ = 0;
      local_60 = lcIconLoader::category.name;
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)&local_58,"Trying loader engine for theme.");
      QDebug::~QDebug((QDebug *)&local_58);
    }
    this_00 = (QFontIconEngine *)operator_new(0x50);
    QIconLoaderEngine::QIconLoaderEngine((QIconLoaderEngine *)this_00,iconName);
    if (pQVar9 != (QFontIconEngine *)0x0) {
      (*(pQVar9->super_QIconEngine)._vptr_QIconEngine[1])(pQVar9);
    }
LAB_0026295f:
    iVar4 = (*(this_00->super_QIconEngine)._vptr_QIconEngine[0xd])(this_00);
    pQVar9 = this_00;
    if ((char)iVar4 == '\0') goto LAB_00262ad3;
  }
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78.d._0_4_ = 2;
    local_78._4_8_ = 0;
    local_78._12_8_ = 0;
    local_78.size._4_4_ = 0;
    local_60 = lcIconLoader::category.name;
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)&local_58,"Icon is not available from theme or fallback theme.");
    QDebug::~QDebug((QDebug *)&local_58);
  }
  pQVar1 = QGuiApplicationPrivate::platform_theme;
  if (QGuiApplicationPrivate::platform_theme != (QPlatformTheme *)0x0) {
    lcIconLoader();
    if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_78.d._0_4_ = 2;
      local_78._4_8_ = 0;
      local_78._12_8_ = 0;
      local_78.size._4_4_ = 0;
      local_60 = lcIconLoader::category.name;
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)&local_58,"Trying platform engine.");
      QDebug::~QDebug((QDebug *)&local_58);
    }
    iVar4 = (*pQVar1->_vptr_QPlatformTheme[0xf])(pQVar1,iconName);
    pQVar9 = (QFontIconEngine *)CONCAT44(extraout_var,iVar4);
    if (pQVar9 != (QFontIconEngine *)0x0) {
      iVar4 = (*(pQVar9->super_QIconEngine)._vptr_QIconEngine[0xd])(pQVar9);
      if ((char)iVar4 == '\0') {
        if (this_00 != (QFontIconEngine *)0x0) {
          (*(this_00->super_QIconEngine)._vptr_QIconEngine[1])(this_00);
        }
        lcIconLoader();
        if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
           ) {
          local_78.d._0_4_ = 2;
          local_78._4_8_ = 0;
          local_78._12_8_ = 0;
          local_78.size._4_4_ = 0;
          local_60 = lcIconLoader::category.name;
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)&local_58,"Icon provided by platform engine.");
          QDebug::~QDebug((QDebug *)&local_58);
        }
        goto LAB_00262ad3;
      }
      (*(pQVar9->super_QIconEngine)._vptr_QIconEngine[1])(pQVar9);
    }
  }
  pQVar9 = this_00;
  if (this_00 == (QFontIconEngine *)0x0) {
    pQVar9 = (QFontIconEngine *)operator_new(0x50);
    QIconLoaderEngine::QIconLoaderEngine((QIconLoaderEngine *)pQVar9,iconName);
  }
LAB_00262ad3:
  lcIconLoader();
  if (((byte)lcIconLoader::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_78.d._0_4_ = 2;
    local_78._4_8_ = 0;
    local_78._12_8_ = 0;
    local_78.size._4_4_ = 0;
    local_60 = lcIconLoader::category.name;
    QMessageLogger::debug();
    pQVar5 = QDebug::operator<<((QDebug *)&local_58,"Resulting engine");
    local_90._vptr_QIconEngine = (_func_int **)pQVar5->stream;
    ((Stream *)local_90._vptr_QIconEngine)->ref = ((Stream *)local_90._vptr_QIconEngine)->ref + 1;
    ::operator<<((Stream *)local_88,&local_90);
    QDebug::~QDebug((QDebug *)local_88);
    QDebug::~QDebug((QDebug *)&local_90);
    QDebug::~QDebug((QDebug *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return &pQVar9->super_QIconEngine;
}

Assistant:

QIconEngine *QIconLoader::iconEngine(const QString &iconName) const
{
    qCDebug(lcIconLoader) << "Resolving icon engine for icon" << iconName;

    std::unique_ptr<QIconEngine> iconEngine;

    if (!m_factory) {
        qCDebug(lcIconLoader) << "Finding a plugin for theme" << themeName();
        // try to find a plugin that supports the current theme
        const int factoryIndex = qt_iconEngineFactoryLoader()->indexOf(themeName());
        if (factoryIndex >= 0)
            m_factory = qobject_cast<QIconEnginePlugin *>(qt_iconEngineFactoryLoader()->instance(factoryIndex));
    }
    if (m_factory && *m_factory)
        iconEngine.reset(m_factory.value()->create(iconName));

    if (hasUserTheme()) {
        if (!iconEngine || iconEngine->isNull()) {
            if (QFontDatabase::families().contains(themeName())) {
                QFont maybeIconFont(themeName());
                maybeIconFont.setStyleStrategy(QFont::NoFontMerging);
                qCDebug(lcIconLoader) << "Trying font icon engine.";
                iconEngine.reset(new QFontIconEngine(iconName, maybeIconFont));
            }
        }
        if (!iconEngine || iconEngine->isNull()) {
            qCDebug(lcIconLoader) << "Trying loader engine for theme.";
            iconEngine.reset(new QIconLoaderEngine(iconName));
        }
    }

    if (!iconEngine || iconEngine->isNull()) {
        qCDebug(lcIconLoader) << "Icon is not available from theme or fallback theme.";
        if (auto *platformTheme = QGuiApplicationPrivate::platformTheme()) {
            qCDebug(lcIconLoader) << "Trying platform engine.";
            std::unique_ptr<QIconEngine> themeEngine(platformTheme->createIconEngine(iconName));
            if (themeEngine && !themeEngine->isNull()) {
                iconEngine = std::move(themeEngine);
                qCDebug(lcIconLoader) << "Icon provided by platform engine.";
            }
        }
    }
    // We need to maintain the invariant that the QIcon has a valid engine
    if (!iconEngine)
        iconEngine.reset(new QIconLoaderEngine(iconName));

    qCDebug(lcIconLoader) << "Resulting engine" << iconEngine.get();
    return iconEngine.release();
}